

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::removeNode(MemoryLeakDetectorTable *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  
  pMVar1 = MemoryLeakDetectorList::removeNode(this->table_ + (ulong)memory % 0x49,memory);
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::removeNode(char* memory)
{
    return table_[hash(memory)].removeNode(memory);
}